

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::rValueErrorCheck
          (TParseContext *this,TSourceLoc *loc,char *op,TIntermTyped *node)

{
  TIntermediate *pTVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  long *plVar3;
  
  TParseContextBase::rValueErrorCheck(&this->super_TParseContextBase,loc,op,node);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])(node);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != (long *)0x0) {
    lVar4 = (**(code **)(*plVar3 + 0x108))(plVar3);
    if ((*(byte *)(lVar4 + 0xe) & 1) == 0) {
      lVar4 = (**(code **)(*plVar3 + 0x108))(plVar3);
      if ((*(byte *)(lVar4 + 0xc) & 0x40) != 0) {
        lVar4 = (**(code **)(*plVar3 + 400))(plVar3);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"can\'t read from explicitly-interpolated object: ",op,
                   *(undefined8 *)(lVar4 + 8));
      }
    }
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
  if (((((*(uint *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0xff80) == 0x100) &&
       (pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
       pTVar1->localSizeNotDefault[0] == false)) && (pTVar1->localSizeNotDefault[1] == false)) &&
     (((pTVar1->localSizeNotDefault[2] == false && (pTVar1->localSizeSpecId[0] == -1)) &&
      ((pTVar1->localSizeSpecId[1] == -1 && (pTVar1->localSizeSpecId[2] == -1)))))) {
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)
              (this,loc,
               "can\'t read from gl_WorkGroupSize before a fixed workgroup size has been declared",
               op,"",UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void TParseContext::rValueErrorCheck(const TSourceLoc& loc, const char* op, TIntermTyped* node)
{
    // Let the base class check errors
    TParseContextBase::rValueErrorCheck(loc, op, node);

    TIntermSymbol* symNode = node->getAsSymbolNode();
    if (!(symNode && symNode->getQualifier().isWriteOnly())) // base class checks
        if (symNode && symNode->getQualifier().isExplicitInterpolation())
            error(loc, "can't read from explicitly-interpolated object: ", op, symNode->getName().c_str());

    // local_size_{xyz} must be assigned or specialized before gl_WorkGroupSize can be assigned.
    if(node->getQualifier().builtIn == EbvWorkGroupSize &&
       !(intermediate.isLocalSizeSet() || intermediate.isLocalSizeSpecialized()))
        error(loc, "can't read from gl_WorkGroupSize before a fixed workgroup size has been declared", op, "");
}